

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O2

void __thiscall FileTest_OpenRetry_Test::FileTest_OpenRetry_Test(FileTest_OpenRetry_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016e630;
  return;
}

Assistant:

TEST(FileTest, OpenRetry) {
  write_file("test", "there must be something here");
  scoped_ptr<file> f{FMT_NULL};
  EXPECT_RETRY(f.reset(new file("test", file::RDONLY)),
               open, "cannot open file test");
#ifndef _WIN32
  char c = 0;
  f->read(&c, 1);
#endif
}